

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O1

void test_boundary_access<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false>>>
               (void)

{
  node_ptr plVar1;
  pointer pvVar2;
  pool<boost::default_user_allocator_malloc_free> *ppVar3;
  mapped_type *pmVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  orderedBoundaries;
  Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>
  m;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_308;
  undefined1 local_2f0 [8];
  undefined8 local_2e8;
  shared_count sStack_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  _Base_ptr local_2c0;
  _Base_ptr local_2b8;
  _Base_ptr local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined **local_298;
  undefined1 local_290;
  _Base_ptr local_288;
  _Base_ptr local_280;
  pool<boost::default_user_allocator_malloc_free> *local_268;
  undefined1 local_260 [560];
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false>>>>
            ();
  local_268 = (pool<boost::default_user_allocator_malloc_free> *)operator_new(0x38);
  (((Entry_constructor *)&local_268->super_simple_segregated_storage<unsigned_long>)->entryPool_).
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (local_268->list).ptr = (char *)0x0;
  (local_268->list).sz = 0;
  local_268->requested_size = 0x18;
  local_268->next_size = 0x20;
  local_268->start_size = 0x20;
  local_268->max_size = 0;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false>>>
  ::RU_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false>>>
              *)local_260,&local_308,(Column_settings *)local_268);
  if (local_308.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_308.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar7 = 1;
    uVar6 = 0;
    do {
      if (uVar7 == 6) {
        local_2a8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_2a0 = "";
        local_2b8 = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
        local_2b0 = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2a8,0x255,
                   &local_2b8);
        if (local_260[0xd8] == true) {
          Gudhi::persistence_matrix::
          Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>_>
          ::_orderRows((Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>_>
                        *)(local_260 + 0x68));
        }
        local_298 = (undefined **)CONCAT44(local_298._4_4_,uVar7 - 1);
        pmVar4 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)(local_260 + 0xe0),(key_type *)&local_298);
        plVar1 = (pmVar4->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
        local_2f0[0] = plVar1 == (node_ptr)&pmVar4->column_ || plVar1 == (node_ptr)0x0;
        local_2e8 = 0;
        sStack_2e0.pi_ = (sp_counted_base *)0x0;
        local_2c8 = "m.get_column(i).is_empty()";
        local_2c0 = (_Base_ptr)0x1b2671;
        local_290 = _S_red;
        local_298 = &PTR__lazy_ostream_001e64f8;
        local_288 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
        local_280 = (_Base_ptr)&local_2c8;
        local_2d8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_2d0 = "";
        boost::test_tools::tt_detail::report_assertion
                  (local_2f0,
                   (_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)&local_298,&local_2d8,0x255,1,0,0);
        boost::detail::shared_count::~shared_count(&sStack_2e0);
      }
      else {
        if (local_260[0xd8] == true) {
          Gudhi::persistence_matrix::
          Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>_>
          ::_orderRows((Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>_>
                        *)(local_260 + 0x68));
        }
        local_298 = (undefined **)CONCAT44(local_298._4_4_,uVar7 - 1);
        pmVar4 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)(local_260 + 0xe0),(key_type *)&local_298);
        pvVar2 = local_308.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        get_column_content_via_iterators<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false>>>>
                  ((column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>_>
                    *)&local_298,pmVar4);
        test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false>>>>
                  (pvVar2 + uVar6,
                   (column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>_>
                    *)&local_298);
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&local_298);
      }
      uVar6 = (ulong)uVar7;
      uVar5 = ((long)local_308.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_308.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      uVar7 = uVar7 + 1;
    } while (uVar6 <= uVar5 && uVar5 - uVar6 != 0);
  }
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>
  ::reset((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>
           *)local_260,(Column_settings *)local_268);
  ppVar3 = local_268;
  if (local_268 != (pool<boost::default_user_allocator_malloc_free> *)0x0) {
    boost::pool<boost::default_user_allocator_malloc_free>::purge_memory(local_268);
    operator_delete(ppVar3,0x38);
  }
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>
  ::~RU_matrix((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>
                *)local_260);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_308);
  return;
}

Assistant:

void test_boundary_access() {
  auto orderedBoundaries = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(orderedBoundaries, 5);

  for (unsigned int i = 0; i < orderedBoundaries.size(); ++i) {
    if constexpr (is_RU<Matrix>()) {
      if (i == 5) {
        BOOST_CHECK(m.get_column(i).is_empty());  // reduced
      } else {
        const auto& col = m.get_column(i);  // to force the const version
        test_column_equality<typename Matrix::Column>(orderedBoundaries[i], get_column_content_via_iterators(col));
      }
    } else {
      const auto& col = m.get_column(i);  // to force the const version
      test_column_equality<typename Matrix::Column>(orderedBoundaries[i], get_column_content_via_iterators(col));
    }
  }
}